

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O0

int run_test_udp_send_unix(void)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int fd;
  uv_buf_t buf;
  uv_loop_t *loop;
  uv_udp_send_t req;
  uv_udp_t handle;
  char cStack_78;
  char cStack_77;
  sockaddr_un addr;
  
  auVar3 = uv_buf_init("PING");
  buf.base = auVar3._8_8_;
  _r = auVar3._0_8_;
  buf.len = uv_default_loop();
  memset((void *)((long)&handle.write_completed_queue.prev + 2),0,0x6e);
  handle.write_completed_queue.prev._2_2_ = 1;
  handle.write_completed_queue.prev._4_1_ = '/';
  handle.write_completed_queue.prev._5_1_ = 't';
  handle.write_completed_queue.prev._6_1_ = 'm';
  handle.write_completed_queue.prev._7_1_ = 'p';
  cStack_78 = '/';
  cStack_77 = 'u';
  addr.sun_family._0_1_ = 'v';
  addr.sun_family._1_1_ = '-';
  iVar1 = socket(1,1,0);
  if ((long)iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x143,"fd",">=","0",(long)iVar1,">=",0);
    abort();
  }
  unlink("/tmp/uv-test-sock");
  iVar2 = bind(iVar1,(sockaddr *)((long)&handle.write_completed_queue.prev + 2),0x6e);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x146,"bind(fd, (const struct sockaddr*)&addr, sizeof addr)","==","0",(long)iVar2,"==",
            0);
    abort();
  }
  iVar2 = listen(iVar1,1);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x147,"listen(fd, 1)","==","0",(long)iVar2,"==",0);
    abort();
  }
  iVar2 = uv_udp_init(buf.len,&req.bufsml[3].len);
  if ((long)iVar2 == 0) {
    iVar2 = uv_udp_open(&req.bufsml[3].len,iVar1);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
              ,0x14c,"r","==","0",(long)iVar2,"==",0);
      abort();
    }
    uv_run(buf.len,0);
    iVar2 = uv_udp_send(&loop,&req.bufsml[3].len,&r,1,
                        (undefined1 *)((long)&handle.write_completed_queue.prev + 2),0);
    if ((long)iVar2 == 0) {
      uv_close(&req.bufsml[3].len,0);
      uv_run(buf.len,0);
      close(iVar1);
      unlink("/tmp/uv-test-sock");
      close_loop((uv_loop_t *)buf.len);
      iVar1 = uv_loop_close(buf.len);
      if ((long)iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
              ,0x15c,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x155,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
          ,0x14a,"r","==","0",(long)iVar2,"==",0);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT_LT(strlen(TEST_PIPENAME), sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT_GE(fd, 0);

  unlink(TEST_PIPENAME);
  ASSERT_OK(bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT_OK(listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT_OK(r);
  r = uv_udp_open(&handle, fd);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}